

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O0

void amrex::average_node_to_cellcenter
               (MultiFab *cc,int dcomp,MultiFab *nd,int scomp,int ncomp,int ngrow)

{
  int iVar1;
  bool bVar2;
  int in_ECX;
  int in_ESI;
  undefined8 in_RDI;
  undefined1 do_tiling_;
  int in_R8D;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *ndarr;
  Array4<double> *ccarr;
  Box bx;
  MFIter mfi;
  MFIter *in_stack_fffffffffffffca0;
  FabArray<amrex::FArrayBox> *this;
  undefined4 in_stack_fffffffffffffcc8;
  int iVar3;
  undefined4 in_stack_fffffffffffffccc;
  int iVar4;
  undefined4 in_stack_fffffffffffffcd0;
  int iVar5;
  undefined4 in_stack_fffffffffffffcd4;
  int iVar6;
  undefined8 in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  undefined1 local_2e8 [136];
  MFIter *local_260;
  undefined1 local_254 [16];
  int local_244;
  int iStack_240;
  undefined1 local_238 [224];
  PCData<amrex::FArrayBox> *local_158;
  MFIter *local_150;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  undefined4 local_134;
  pointer local_130;
  undefined4 local_124;
  pointer local_120;
  undefined4 local_114;
  MultiArray4<double> local_110;
  undefined4 local_104;
  pointer local_100;
  undefined4 local_f4;
  pointer local_f0;
  undefined4 local_e4;
  pointer local_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  _Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false> local_c8;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  PCData<amrex::FArrayBox> *local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  PCData<amrex::FArrayBox> *local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  PCData<amrex::FArrayBox> *local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  PCData<amrex::FArrayBox> *local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  PCData<amrex::FArrayBox> *local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  PCData<amrex::FArrayBox> *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  PCData<amrex::FArrayBox> *local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  MFIter *local_8;
  
  do_tiling_ = (undefined1)((ulong)in_RDI >> 0x38);
  local_238._104_4_ = in_R8D;
  local_238._108_4_ = in_ECX;
  local_238._124_4_ = in_ESI;
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                 (bool)do_tiling_);
  while (bVar2 = MFIter::isValid((MFIter *)local_238), bVar2) {
    this = (FabArray<amrex::FArrayBox> *)local_238;
    MFIter::growntilebox
              ((MFIter *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    in_stack_fffffffffffffca0 = (MFIter *)(local_2e8 + 0x48);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(this,in_stack_fffffffffffffca0);
    local_260 = in_stack_fffffffffffffca0;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(this,in_stack_fffffffffffffca0);
    local_e4 = 0;
    local_f4 = 1;
    in_stack_fffffffffffffd08 = CONCAT44(local_254._4_4_,local_254._0_4_);
    local_104 = 2;
    local_110.hp = (Array4<double> *)(local_254 + 0xc);
    local_114 = 0;
    local_120 = (pointer)(local_254 + 0xc);
    local_124 = 1;
    local_130 = (pointer)(local_254 + 0xc);
    local_134 = 2;
    for (iVar6 = 0; iVar5 = local_254._8_4_, iVar6 < (int)local_238._104_4_; iVar6 = iVar6 + 1) {
      for (; iVar4 = local_254._4_4_, iVar5 <= iStack_240; iVar5 = iVar5 + 1) {
        for (; iVar1 = local_254._0_4_, iVar4 <= local_244; iVar4 = iVar4 + 1) {
          while (iVar3 = iVar1, iVar3 <= (int)local_254._12_4_) {
            local_150 = local_260;
            local_30 = iVar6 + local_238._108_4_;
            local_3c = iVar3 + 1;
            local_48 = iVar6 + local_238._108_4_;
            local_58 = iVar4 + 1;
            local_60 = iVar6 + local_238._108_4_;
            local_6c = iVar3 + 1;
            local_70 = iVar4 + 1;
            local_78 = iVar6 + local_238._108_4_;
            local_8c = iVar5 + 1;
            local_90 = iVar6 + local_238._108_4_;
            local_9c = iVar3 + 1;
            local_a4 = iVar5 + 1;
            local_a8 = iVar6 + local_238._108_4_;
            local_b8 = iVar4 + 1;
            local_bc = iVar5 + 1;
            local_c0 = iVar6 + local_238._108_4_;
            local_cc = iVar3 + 1;
            local_d0 = iVar4 + 1;
            local_d4 = iVar5 + 1;
            local_d8 = iVar6 + local_238._108_4_;
            local_8 = local_260;
            local_18 = iVar6 + local_238._124_4_;
            *(double *)
             ((long)&((local_260->m_fa)._M_t.
                      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                      .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                     _vptr_FabArrayBase +
             ((long)(iVar3 - local_260->currentIndex) +
              (long)(iVar4 - local_260->beginIndex) * (long)local_260->fabArray +
              (long)(iVar5 - local_260->endIndex) * *(long *)(local_260->tile_size).vect +
             (long)local_18 * *(long *)((local_260->tile_size).vect + 2)) * 8) =
                 (*(double *)
                   (((IntVect *)(local_2e8._0_8_ + 0x40))->vect +
                   ((long)(iVar3 - local_2e8._32_4_) +
                    (long)(iVar4 - local_2e8._36_4_) * local_2e8._8_8_ +
                    (long)(iVar5 - local_2e8._40_4_) * local_2e8._16_8_ +
                   (long)local_30 * local_2e8._24_8_) * 2 + -0x10) +
                  *(double *)
                   (((IntVect *)(local_2e8._0_8_ + 0x40))->vect +
                   ((long)(local_3c - local_2e8._32_4_) +
                    (long)(iVar4 - local_2e8._36_4_) * local_2e8._8_8_ +
                    (long)(iVar5 - local_2e8._40_4_) * local_2e8._16_8_ +
                   (long)local_48 * local_2e8._24_8_) * 2 + -0x10) +
                  *(double *)
                   (((IntVect *)(local_2e8._0_8_ + 0x40))->vect +
                   ((long)(iVar3 - local_2e8._32_4_) +
                    (long)(local_58 - local_2e8._36_4_) * local_2e8._8_8_ +
                    (long)(iVar5 - local_2e8._40_4_) * local_2e8._16_8_ +
                   (long)local_60 * local_2e8._24_8_) * 2 + -0x10) +
                  *(double *)
                   (((IntVect *)(local_2e8._0_8_ + 0x40))->vect +
                   ((long)(local_6c - local_2e8._32_4_) +
                    (long)(local_70 - local_2e8._36_4_) * local_2e8._8_8_ +
                    (long)(iVar5 - local_2e8._40_4_) * local_2e8._16_8_ +
                   (long)local_78 * local_2e8._24_8_) * 2 + -0x10) +
                  *(double *)
                   (((IntVect *)(local_2e8._0_8_ + 0x40))->vect +
                   ((long)(iVar3 - local_2e8._32_4_) +
                    (long)(iVar4 - local_2e8._36_4_) * local_2e8._8_8_ +
                    (long)(local_8c - local_2e8._40_4_) * local_2e8._16_8_ +
                   (long)local_90 * local_2e8._24_8_) * 2 + -0x10) +
                  *(double *)
                   (((IntVect *)(local_2e8._0_8_ + 0x40))->vect +
                   ((long)(local_9c - local_2e8._32_4_) +
                    (long)(iVar4 - local_2e8._36_4_) * local_2e8._8_8_ +
                    (long)(local_a4 - local_2e8._40_4_) * local_2e8._16_8_ +
                   (long)local_a8 * local_2e8._24_8_) * 2 + -0x10) +
                  *(double *)
                   (((IntVect *)(local_2e8._0_8_ + 0x40))->vect +
                   ((long)(iVar3 - local_2e8._32_4_) +
                    (long)(local_b8 - local_2e8._36_4_) * local_2e8._8_8_ +
                    (long)(local_bc - local_2e8._40_4_) * local_2e8._16_8_ +
                   (long)local_c0 * local_2e8._24_8_) * 2 + -0x10) +
                 *(double *)
                  (((IntVect *)(local_2e8._0_8_ + 0x40))->vect +
                  ((long)(local_cc - local_2e8._32_4_) +
                   (long)(local_d0 - local_2e8._36_4_) * local_2e8._8_8_ +
                   (long)(local_d4 - local_2e8._40_4_) * local_2e8._16_8_ +
                  (long)local_d8 * local_2e8._24_8_) * 2 + -0x10)) * 0.125;
            local_158 = (PCData<amrex::FArrayBox> *)local_2e8;
            local_144 = iVar6;
            local_140 = iVar5;
            local_13c = iVar4;
            local_138 = iVar3;
            local_c8._M_head_impl = (PCData<amrex::FArrayBox> *)local_2e8;
            local_b4 = iVar3;
            local_b0 = (PCData<amrex::FArrayBox> *)local_2e8;
            local_a0 = iVar4;
            local_98 = (PCData<amrex::FArrayBox> *)local_2e8;
            local_88 = iVar4;
            local_84 = iVar3;
            local_80 = (PCData<amrex::FArrayBox> *)local_2e8;
            local_74 = iVar5;
            local_68 = (PCData<amrex::FArrayBox> *)local_2e8;
            local_5c = iVar5;
            local_54 = iVar3;
            local_50 = (PCData<amrex::FArrayBox> *)local_2e8;
            local_44 = iVar5;
            local_40 = iVar4;
            local_38 = (PCData<amrex::FArrayBox> *)local_2e8;
            local_2c = iVar5;
            local_28 = iVar4;
            local_24 = iVar3;
            local_20 = (PCData<amrex::FArrayBox> *)local_2e8;
            local_14 = iVar5;
            local_10 = iVar4;
            local_c = iVar3;
            iVar1 = iVar3 + 1;
          }
        }
      }
    }
    in_stack_fffffffffffffd10 = local_254._8_4_;
    local_2e8._64_8_ = (PCData<amrex::FArrayBox> *)local_2e8;
    local_238._152_8_ = (pointer)local_254;
    local_238._192_8_ = (pointer)local_254;
    local_100 = (pointer)local_254;
    local_f0 = (pointer)local_254;
    local_e0 = (pointer)local_254;
    MFIter::operator++((MFIter *)local_238);
  }
  MFIter::~MFIter(in_stack_fffffffffffffca0);
  return;
}

Assistant:

void average_node_to_cellcenter (MultiFab& cc, int dcomp,
         const MultiFab& nd, int scomp, int ncomp, int ngrow)
    {
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && cc.isFusingCandidate()) {
            auto const& ccma = cc.arrays();
            auto const& ndma = nd.const_arrays();
            ParallelFor(cc, IntVect(ngrow), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                amrex_avg_nd_to_cc(i, j, k, n, ccma[box_no], ndma[box_no], dcomp, scomp);
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(cc,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box bx = mfi.growntilebox(ngrow);
                Array4<Real> const& ccarr = cc.array(mfi);
                Array4<Real const> const& ndarr = nd.const_array(mfi);

                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, ncomp, i, j, k, n,
                {
                    amrex_avg_nd_to_cc(i, j, k, n, ccarr, ndarr, dcomp, scomp);
                });
            }
        }
    }